

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_txin_txinreference.cpp
# Opt level: O0

void __thiscall
TxInReference_Constractor_Test::~TxInReference_Constractor_Test
          (TxInReference_Constractor_Test *this)

{
  TxInReference_Constractor_Test *this_local;
  
  testing::Test::~Test(&this->super_Test);
  return;
}

Assistant:

TEST(TxInReference, Constractor) {
  {
    TxIn txin(exp_txid, exp_index, exp_sequence);
    TxInReference txin_ref(txin);

    EXPECT_EQ(txin_ref.GetVout(), exp_index);
    EXPECT_EQ(txin_ref.GetSequence(), exp_sequence);
    EXPECT_STREQ(txin_ref.GetTxid().GetHex().c_str(),
                 exp_txid.GetHex().c_str());
  }
}